

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O3

kbcore_t * kbcore_init(cmd_ln_t *config)

{
  feat_t **ppfVar1;
  mdef_t *mdef;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  cmn_type_t cmn;
  agc_type_t agc;
  int iVar6;
  int32 iVar7;
  kbcore_t *kbc;
  char *pcVar8;
  cmd_ln_t *pcVar9;
  long lVar10;
  logmath_t *logmath;
  char *pcVar11;
  long lVar12;
  feat_t *pfVar13;
  long lVar14;
  char *pcVar15;
  dict_t *pdVar16;
  subvq_t *psVar17;
  gs_t *pgVar18;
  fillpen_t *f;
  dict2pid_t *pdVar19;
  uint autofillphone;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,0x1bc,"Begin Initialization of Core Models:\n");
  kbc = (kbcore_t *)
        __ckd_calloc__(1,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                       ,0x1be);
  kbc->config = config;
  kbc->mgau = (mgau_model_t *)0x0;
  kbc->tmat = (tmat_t *)0x0;
  kbc->fcb = (feat_t *)0x0;
  kbc->mdef = (mdef_t *)0x0;
  kbc->dict = (dict_t *)0x0;
  kbc->dict2pid = (dict2pid_t *)0x0;
  kbc->fillpen = (fillpen_t *)0x0;
  kbc->svq = (subvq_t *)0x0;
  pcVar8 = cmd_ln_str_r(config,"-hmm");
  if (pcVar8 != (char *)0x0) {
    pcVar8 = cmd_ln_str_r(config,"-hmm");
    pcVar8 = string_join(pcVar8,"/feat.params",0);
    pcVar9 = cmd_ln_parse_file_r(config,feat_defn,pcVar8,0);
    if (pcVar9 == (cmd_ln_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x1d0,"Parsed model-specific feature parameters from %s\n",pcVar8);
    }
    ckd_free(pcVar8);
  }
  dVar2 = cmd_ln_float_r(config,"-logbase");
  lVar10 = cmd_ln_int_r(config,"-log3table");
  logmath = logmath_init((float64)dVar2,0,(int)lVar10);
  kbc->logmath = logmath;
  if (logmath == (logmath_t *)0x0) {
    pcVar8 = "Error in logmath_init, exit\n";
    lVar10 = 0x1d7;
  }
  else {
    logs3_report(logmath);
    pcVar8 = cmd_ln_str_r(config,"-feat");
    if (pcVar8 != (char *)0x0) {
      ppfVar1 = &kbc->fcb;
      pcVar11 = cmd_ln_str_r(config,"-cmn");
      cmn = cmn_type_from_str(pcVar11);
      lVar10 = cmd_ln_int_r(config,"-varnorm");
      pcVar11 = cmd_ln_str_r(config,"-agc");
      agc = agc_type_from_str(pcVar11);
      lVar12 = cmd_ln_int_r(config,"-ceplen");
      pfVar13 = feat_init(pcVar8,cmn,(uint)(lVar10 != 0),agc,1,(int32)lVar12);
      *ppfVar1 = pfVar13;
      if (pfVar13 == (feat_t *)0x0) {
        pcVar11 = "feat_init(%s) failed\n";
        lVar10 = 0x1e4;
LAB_0011161e:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,lVar10,pcVar11,pcVar8);
        goto LAB_00111667;
      }
      iVar6 = cmd_ln_exists_r(config,"-cmninit");
      if (iVar6 != 0) {
        pfVar13 = *ppfVar1;
        pcVar8 = cmd_ln_str_r(config,"-cmninit");
        set_cmninit(pfVar13,pcVar8);
      }
      pcVar8 = cmd_ln_str_r(config,"-senmgau");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x1eb,"%s\n",pcVar8);
      iVar6 = strcmp(pcVar8,".cont.");
      if (iVar6 == 0) {
        if ((*ppfVar1)->n_stream != 1) {
          pcVar8 = "#Feature streams(%d) in the feature for continuous HMM!= 1\n";
          lVar10 = 0x1f0;
LAB_0011167d:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,lVar10,pcVar8);
          goto LAB_00111667;
        }
      }
      else {
        iVar6 = strcmp(pcVar8,".semi.");
        if (iVar6 != 0) {
          iVar6 = strcmp(pcVar8,".s3cont.");
          if (iVar6 == 0) {
            pcVar8 = "Secret Mode .s3cont. is used!!\n";
            lVar10 = 0x1f6;
          }
          else {
            iVar6 = strcmp(pcVar8,".s2semi.");
            if (iVar6 != 0) {
              pcVar8 = "Feature should be either .semi. or .cont.\n";
              lVar10 = 0x200;
              goto LAB_0011165b;
            }
            if ((*ppfVar1)->n_stream != 4) {
              pcVar8 = "#Feature streams(%d) in the feature for semi-continuous HMM!= 4\n";
              lVar10 = 0x1fc;
              goto LAB_0011167d;
            }
            pcVar8 = "Secret Mode .s2semi. is used!!\n";
            lVar10 = 0x1fd;
          }
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,lVar10,pcVar8);
        }
      }
      feat_report(kbc->fcb);
      s3_am_init(kbc);
      if (kbc->mdef == (mdef_t *)0x0) {
        __assert_fail("kb->mdef != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                      ,0x20b,"kbcore_t *kbcore_init(cmd_ln_t *)");
      }
      pcVar8 = cmd_ln_str_r(config,"-dict");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "Dictionary file is not specified. \n";
        lVar10 = 0x21b;
        goto LAB_0011165b;
      }
      pcVar11 = cmd_ln_str_r(config,"-fdict");
      mdef = kbc->mdef;
      lVar10 = cmd_ln_int_r(config,"-lts_mismatch");
      lVar12 = cmd_ln_int_r(config,"-mdef_fillers");
      lVar14 = cmd_ln_int_r(config,"-mdef_fillers");
      if (lVar14 == 0) {
        autofillphone = 0;
      }
      else {
        pcVar15 = cmd_ln_str_r(config,"-mode");
        iVar6 = strcmp("allphone",pcVar15);
        if (iVar6 == 0) {
          autofillphone = 1;
        }
        else {
          lVar14 = cmd_ln_int_r(config,"-op_mode");
          autofillphone = (uint)((int)lVar14 == 1);
        }
      }
      pdVar16 = dict_init(mdef,pcVar8,pcVar11,(uint)(lVar10 != 0),(uint)(lVar12 != 0),autofillphone,
                          1);
      kbc->dict = pdVar16;
      if (pdVar16 == (dict_t *)0x0) {
        pcVar15 = "";
        if (pcVar11 != (char *)0x0) {
          pcVar15 = pcVar11;
        }
        pcVar11 = "dict_init(%s,%s) failed\n";
        lVar10 = 0x218;
      }
      else {
        dict_report(pdVar16);
        if (kbc->mgau == (mgau_model_t *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x23d,"Slow GMM computation is used, SVQ and GS will not be used\n");
        }
        else {
          pcVar11 = cmd_ln_str_r(config,"-subvq");
          pcVar8 = cmd_ln_str_r(config,"-gs");
          if (pcVar8 != (char *)0x0 && pcVar11 != (char *)0x0) {
            pcVar8 = 
            "Currently there is no combination scheme of gs and svq in Gaussian Selection\n";
            lVar10 = 0x228;
            goto LAB_0011165b;
          }
          if (pcVar11 != (char *)0x0) {
            dVar2 = cmd_ln_float_r(config,"-varfloor");
            psVar17 = subvq_init(pcVar11,(float64)(double)(float)dVar2,-1,kbc->mgau,config,
                                 kbc->logmath);
            kbc->svq = psVar17;
            if (psVar17 == (subvq_t *)0x0) {
              dVar2 = cmd_ln_float_r(config,"-varfloor");
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                      ,0x22f,"subvq_init (%s, %e, -1) failed\n",SUB84((double)(float)dVar2,0),
                      pcVar11);
              goto LAB_00111667;
            }
          }
          if (pcVar8 != (char *)0x0) {
            pgVar18 = gs_read(pcVar8,kbc->logmath);
            kbc->gs = pgVar18;
            if (pgVar18 == (gs_t *)0x0) {
              pcVar11 = "gs_read(%s) failed\n";
              lVar10 = 0x234;
              goto LAB_0011161e;
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                    ,0x237,"After reading the number of senones: %d\n",(ulong)(uint)pgVar18->n_mgau)
            ;
          }
        }
        if (kbc->dict == (dict_t *)0x0) {
          __assert_fail("kb->dict",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                        ,0x240,"kbcore_t *kbcore_init(cmd_ln_t *)");
        }
        pcVar8 = cmd_ln_str_r(config,"-fillpen");
        pdVar16 = kbc->dict;
        if (pcVar8 == (char *)0x0) {
          if (pdVar16 != (dict_t *)0x0) goto LAB_0011128a;
          f = kbc->fillpen;
        }
        else {
          if (pdVar16 == (dict_t *)0x0) {
            pcVar8 = cmd_ln_str_r(config,"-fillpen");
            pcVar11 = "No dictionary for associating filler penalty file(%s)\n";
            lVar10 = 0x25c;
            goto LAB_0011161e;
          }
LAB_0011128a:
          pcVar8 = cmd_ln_str_r(config,"-fillpen");
          dVar2 = cmd_ln_float_r(config,"-silprob");
          dVar3 = cmd_ln_float_r(config,"-fillprob");
          dVar4 = cmd_ln_float_r(config,"-lw");
          dVar5 = cmd_ln_float_r(config,"-wip");
          f = fillpen_init(pdVar16,pcVar8,(float64)(double)(float)dVar2,
                           (float64)(double)(float)dVar3,(float64)(double)(float)dVar4,
                           (float64)(double)(float)dVar5,kbc->logmath);
          kbc->fillpen = f;
          if (f == (fillpen_t *)0x0) {
            pcVar8 = cmd_ln_str_r(config,"-fillpen");
            pcVar11 = "fillpen_init(%s) failed\n";
            lVar10 = 0x266;
            goto LAB_0011161e;
          }
        }
        fillpen_report(f);
        if (kbc->tmat == (tmat_t *)0x0) {
          __assert_fail("kb->tmat",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                        ,0x26d,"kbcore_t *kbcore_init(cmd_ln_t *)");
        }
        iVar7 = tmat_chk_1skip(kbc->tmat);
        if (iVar7 < 0) {
          pcVar8 = 
          "Transition matrices contain arcs skipping more than 1 state, not supported in s3.x\'s decode\n"
          ;
          lVar10 = 0x271;
          goto LAB_0011165b;
        }
        if ((kbc->mdef != (mdef_t *)0x0) && (kbc->dict != (dict_t *)0x0)) {
          pdVar19 = dict2pid_build(kbc->mdef,kbc->dict,1,kbc->logmath);
          kbc->dict2pid = pdVar19;
        }
        dict2pid_report(kbc->dict2pid);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x27f,"Inside kbcore: Verifying models consistency ...... \n");
        if (((kbc->fcb != (feat_t *)0x0) && (kbc->mgau != (mgau_model_t *)0x0)) &&
           (kbc->fcb->out_dim != kbc->mgau->veclen)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x285,"Feature streamlen(%d) != mgau streamlen(%d)\n");
          goto LAB_00111667;
        }
        if ((-1 < kbc->dict->startwid) && (-1 < kbc->dict->finishwid)) {
          if (-1 < kbc->mdef->sil) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                    ,0x295,"End of Initialization of Core Models:\n");
            return kbc;
          }
          pcVar11 = "Silence phone \'%s\' not in mdef\n";
          pcVar8 = "SIL";
          lVar10 = 0x292;
          goto LAB_0011161e;
        }
        pcVar11 = "%s or %s not in dictionary\n";
        pcVar8 = "<s>";
        pcVar15 = "</s>";
        lVar10 = 0x28d;
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,lVar10,pcVar11,pcVar8,pcVar15);
      goto LAB_00111667;
    }
    pcVar8 = "Please specify the feature type using -feat\n";
    lVar10 = 0x1dd;
  }
LAB_0011165b:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,lVar10,pcVar8);
LAB_00111667:
  exit(1);
}

Assistant:

kbcore_t *
kbcore_init(cmd_ln_t *config)
{
    kbcore_t *kb;
    int i;
    s3cipid_t sil;
    char const *str;

    E_INFO("Begin Initialization of Core Models:\n");

    kb = (kbcore_t *) ckd_calloc(1, sizeof(kbcore_t));
    kb->config = config;
    kb->fcb = NULL;
    kb->mdef = NULL;
    kb->dict = NULL;
    kb->dict2pid = NULL;
    kb->fillpen = NULL;

    kb->mgau = NULL;
    kb->svq = NULL;
    kb->tmat = NULL;

    /* Look for a feat.params very early on, because it influences
     * everything below. */
    if (cmd_ln_str_r(config, "-hmm")) {
        char *pfile;
        pfile = string_join(cmd_ln_str_r(config, "-hmm"), "/feat.params", NULL);
        if (cmd_ln_parse_file_r(config, feat_defn, pfile, FALSE) == 0) {
            E_INFO("Parsed model-specific feature parameters from %s\n", pfile);
        }
        ckd_free(pfile);
    }

    if ((kb->logmath = logmath_init(cmd_ln_float64_r(config, "-logbase"), 0,
                                    cmd_ln_int32_r(config, "-log3table"))) == NULL)
        E_FATAL("Error in logmath_init, exit\n");

    if (REPORT_KBCORE)
        logs3_report(kb->logmath);

    if (!(str = cmd_ln_str_r(config, "-feat")))
        E_FATAL("Please specify the feature type using -feat\n");
    else {
        if ((kb->fcb =
             feat_init(str, cmn_type_from_str(cmd_ln_str_r(config, "-cmn")),
                       cmd_ln_boolean_r(config, "-varnorm"),
                       agc_type_from_str(cmd_ln_str_r(config, "-agc")),
                       REPORT_KBCORE, cmd_ln_int32_r(config, "-ceplen"))) == NULL)
            E_FATAL("feat_init(%s) failed\n", str);

        if (cmd_ln_exists_r(config, "-cmninit")) {
            set_cmninit(kb->fcb, cmd_ln_str_r(config, "-cmninit"));
        }

        str = cmd_ln_str_r(config, "-senmgau");
        E_INFO("%s\n", str);
        if (strcmp(str, ".cont.") == 0) {
            if (feat_n_stream(kb->fcb) != 1)
                E_FATAL
                    ("#Feature streams(%d) in the feature for continuous HMM!= 1\n",
                     feat_n_stream(kb->fcb));
        }
        else if (strcmp(str, ".semi.") == 0) {
        }
        else if (strcmp(str, ".s3cont.") == 0) {

            E_WARN("Secret Mode .s3cont. is used!!\n");
        }
        else if (strcmp(str, ".s2semi.") == 0) {
            if (feat_n_stream(kb->fcb) != 4)
                E_FATAL
                    ("#Feature streams(%d) in the feature for semi-continuous HMM!= 4\n",
                     feat_n_stream(kb->fcb));
            E_WARN("Secret Mode .s2semi. is used!!\n");
        }
        else {
            E_FATAL("Feature should be either .semi. or .cont.\n");
        }
    }

    if (REPORT_KBCORE) {
        feat_report(kb->fcb);
    }

    /* Initialize sphinx 3 hmm */
    s3_am_init(kb);

    assert(kb->mdef != NULL);

    if ((str = cmd_ln_str_r(config, "-dict"))) {
        char const *fdictfile = cmd_ln_str_r(config, "-fdict");

        if ((kb->dict =
             dict_init(kb->mdef, str, fdictfile,
                       cmd_ln_boolean_r(config, "-lts_mismatch"),
		       cmd_ln_boolean_r(config, "-mdef_fillers"),
		       (cmd_ln_boolean_r(config, "-mdef_fillers")
			&& (!strcmp("allphone", cmd_ln_str_r(config, "-mode")) 
			    || cmd_ln_int32_r(config, "-op_mode") == 1)),
                       REPORT_KBCORE)) == NULL)
            E_FATAL("dict_init(%s,%s) failed\n", str, fdictfile ? fdictfile : "");
    }
    else {
        E_FATAL("Dictionary file is not specified. \n");
    }

    assert(kb->dict != NULL);
    if (REPORT_KBCORE) {
        dict_report(kb->dict);
    }

    if (kb->mgau) {
        char const *subvqfile = cmd_ln_str_r(config, "-subvq");
        char const *gsfile = cmd_ln_str_r(config, "-gs");
        if (subvqfile && gsfile) {
            E_FATAL
                ("Currently there is no combination scheme of gs and svq in Gaussian Selection\n");
        }
        if (subvqfile) {
            if ((kb->svq =
                 subvq_init(subvqfile, cmd_ln_float32_r(config, "-varfloor"),
                            -1, kb->mgau, config, kb->logmath)) == NULL)
                E_FATAL("subvq_init (%s, %e, -1) failed\n", subvqfile,
                        cmd_ln_float32_r(config, "-varfloor"));
        }

        if (gsfile) {
            if ((kb->gs = gs_read(gsfile, kb->logmath)) == NULL)
                E_FATAL("gs_read(%s) failed\n", gsfile);

            E_INFO("After reading the number of senones: %d\n",
                   kb->gs->n_mgau);
        }
        /* SVQ and GS-specific checking should be done */
    }
    else {
        E_INFO
            ("Slow GMM computation is used, SVQ and GS will not be used\n");
    }

    assert(kb->dict);
    
#if 0
    if (cmd_ln_str_r(config, "-lm") || cmd_ln_str_r(config, "-lmctlfn")) {
        kb->lmset = lmset_init(cmd_ln_str_r(config, "-lm"),
                               cmd_ln_str_r(config, "-lmctlfn"),
                               cmd_ln_str_r(config, "-ctl_lm"),        /* This two are ugly. */
                               cmd_ln_str_r(config, "-lmname"),
                               cmd_ln_str_r(config, "-lmdumpdir"),
                               cmd_ln_float32_r(config, "-lw"),
                               cmd_ln_float32_r(config, "-wip"),
                               cmd_ln_float32_r(config, "-uw"),
                               kb->dict,
                               kb->logmath);

        /* CHECK: check whether LM has a start word and end word  */
        for (i = 0; i < kb->lmset->n_lm; i++) {
            checkLMstartword(kb->lmset->lmarray[i],
                             lmset_idx_to_name(kb->lmset, i));
        }

    }
#endif

    if (cmd_ln_str_r(config, "-fillpen") || kb->dict) {
        if (!kb->dict)          /* Sic */
            E_FATAL
                ("No dictionary for associating filler penalty file(%s)\n",
                 cmd_ln_str_r(config, "-fillpen"));

        if ((kb->fillpen =
             fillpen_init(kb->dict,
                          cmd_ln_str_r(config, "-fillpen"),
                          cmd_ln_float32_r(config, "-silprob"),
                          cmd_ln_float32_r(config, "-fillprob"),
                          cmd_ln_float32_r(config, "-lw"),
                          cmd_ln_float32_r(config, "-wip"),
                          kb->logmath)) == NULL)
            E_FATAL("fillpen_init(%s) failed\n", cmd_ln_str_r(config, "-fillpen"));
    }

    if (REPORT_KBCORE) {
        fillpen_report(kb->fillpen);
    }

    assert(kb->tmat);
    /* CHECK: that HMM topology restrictions are not violated */
    if (tmat_chk_1skip(kb->tmat) < 0)
        E_FATAL
            ("Transition matrices contain arcs skipping more than 1 state, not supported in s3.x's decode\n");

    /* This should be removed and put into the search */
    /* NO KIDDING! */
    if (kb->mdef && kb->dict) { /* Initialize dict2pid */
        int32 composite = 1;
        kb->dict2pid = dict2pid_build(kb->mdef, kb->dict, composite, kb->logmath);
    }

    if (REPORT_KBCORE) {
        dict2pid_report(kb->dict2pid);
    }
    /* ***************** Verifications ***************** */
    if (REPORT_KBCORE)
        E_INFO("Inside kbcore: Verifying models consistency ...... \n");

    if (kb->fcb && kb->mgau) {
        /* Verify feature streams against gauden codebooks */
        if (feat_dimension(kb->fcb) != mgau_veclen(kb->mgau))
            E_FATAL("Feature streamlen(%d) != mgau streamlen(%d)\n",
                    feat_dimension(kb->fcb), mgau_veclen(kb->mgau));
    }


    /* CHECK: Verify whether the <s> and </s> is in the dictionary. */
    if (NOT_S3WID(dict_startwid(kb->dict))
        || NOT_S3WID(dict_finishwid(kb->dict)))
        E_FATAL("%s or %s not in dictionary\n", S3_START_WORD,
                S3_FINISH_WORD);

    /* CHECK: Verify whether <sil> is in the dictionary */
    sil = mdef_silphone(kbcore_mdef(kb));
    if (NOT_S3CIPID(sil))
        E_FATAL("Silence phone '%s' not in mdef\n", S3_SILENCE_CIPHONE);


    E_INFO("End of Initialization of Core Models:\n");
    return kb;
}